

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O2

int64_t __thiscall
mocker::ir::Interpreter::readVal(Interpreter *this,shared_ptr<mocker::ir::Addr> *reg)

{
  element_type *peVar1;
  bool bVar2;
  mapped_type *pmVar3;
  _Elt_pointer pAVar4;
  shared_ptr<mocker::ir::Addr> *addr;
  shared_ptr<mocker::ir::Reg> p;
  
  addr = (shared_ptr<mocker::ir::Addr> *)&p;
  dycLocalReg(addr);
  peVar1 = p.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (p.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    bVar2 = std::operator==(&(p.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr)->identifier,".phi_nan");
    if (bVar2) {
      addr = (shared_ptr<mocker::ir::Addr> *)0xffffffffffffff85;
    }
    else {
      pAVar4 = (this->ars).c.
               super__Deque_base<mocker::ir::Interpreter::ActivationRecord,_std::allocator<mocker::ir::Interpreter::ActivationRecord>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (pAVar4 == (this->ars).c.
                    super__Deque_base<mocker::ir::Interpreter::ActivationRecord,_std::allocator<mocker::ir::Interpreter::ActivationRecord>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_first) {
        pAVar4 = (this->ars).c.
                 super__Deque_base<mocker::ir::Interpreter::ActivationRecord,_std::allocator<mocker::ir::Interpreter::ActivationRecord>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 5;
      }
      pmVar3 = std::__detail::
               _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::at((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     *)&pAVar4[-1].localReg,
                    &(p.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                     identifier);
      addr = (shared_ptr<mocker::ir::Addr> *)*pmVar3;
    }
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&p.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  if (peVar1 == (element_type *)0x0) {
    dycGlobalReg((shared_ptr<mocker::ir::Addr> *)&p);
    peVar1 = p.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (p.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      pmVar3 = std::__detail::
               _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::at((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     *)&this->globalReg,
                    &(p.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                     identifier);
      addr = (shared_ptr<mocker::ir::Addr> *)*pmVar3;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&p.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    if (peVar1 == (element_type *)0x0) {
      std::dynamic_pointer_cast<mocker::ir::IntLiteral,mocker::ir::Addr>
                ((shared_ptr<mocker::ir::Addr> *)&p);
      if (p.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        addr = (shared_ptr<mocker::ir::Addr> *)
               ((p.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               identifier)._M_dataplus._M_p;
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&p.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      if (p.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (element_type *)0x0) {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/ir-interpreter/interpreter.cpp"
                      ,0x26d,
                      "std::int64_t mocker::ir::Interpreter::readVal(const std::shared_ptr<Addr> &) const"
                     );
      }
    }
  }
  return (int64_t)addr;
}

Assistant:

std::int64_t Interpreter::readVal(const std::shared_ptr<Addr> &reg) const {
  if (auto p = dycLocalReg(reg)) {
    if (p->getIdentifier() == ".phi_nan")
      return -123;
    return ars.top().localReg.at(p->getIdentifier());
  }
  if (auto p = dycGlobalReg(reg)) {
    return globalReg.at(p->getIdentifier());
  }
  if (auto p = dyc<IntLiteral>(reg)) {
    return p->getVal();
  }
  assert(false);
}